

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.hpp
# Opt level: O0

uint64_t __thiscall Stopwatch::getElapsedNanosec(Stopwatch *this)

{
  rep rVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  uint64_t ns;
  chrono_t endMark;
  uint64_t elns;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffd0;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffffd8;
  uint64_t local_10;
  
  local_10 = in_RDI[1].__r;
  if ((in_RDI[2].__r & 1) != 0) {
    std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffd8.__r,in_stack_ffffffffffffffd0);
    std::chrono::
    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
              (in_RDI);
    rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffd8);
    local_10 = rVar1 + local_10;
  }
  return local_10;
}

Assistant:

uint64_t getElapsedNanosec() const {
		uint64_t elns = elapsed;
		if (isRunning) {
			chrono_t endMark = std::chrono::high_resolution_clock::now();
			uint64_t ns = std::chrono::duration_cast<sw_unit>(endMark - startMark).count();
			elns += ns;
		}
		return elns;
	}